

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.h
# Opt level: O3

Index anurbs::Math::binom(Index n,Index k)

{
  long n_00;
  Index IVar1;
  
  if (k <= n) {
    IVar1 = 1;
    if (((n - k != 0 && k != 0) && (IVar1 = n, k != 1)) && (n_00 = n + -1, n_00 != k)) {
      if (k * 2 < n) {
        IVar1 = binom(n_00,k + -1);
        IVar1 = (IVar1 * n) / k;
      }
      else {
        IVar1 = binom(n_00,k);
        IVar1 = (IVar1 * n) / (n - k);
      }
    }
    return IVar1;
  }
  return 0;
}

Assistant:

constexpr inline Index binom(const Index n, const Index k) noexcept
{
    // clang-format off
    return (k > n               ) ? 0           :  // out of range
           (k == 0 || k == n    ) ? 1           :  // edge
           (k == 1 || k == n - 1) ? n           :  // first
           (k + k < n           ) ?                // recursive:
           (binom(n - 1, k - 1  ) * n) / k      :  //   path to k = 1     faster
           (binom(n - 1, k      ) * n) / (n - k);  //   path to k = n - 1 faster
    // clang-format on
}